

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

jx9_int64 JX9StreamData_Read(void *pHandle,void *pBuffer,jx9_int64 nDatatoRead)

{
  int fd;
  ssize_t nRd;
  jx9_stream_data *pData;
  jx9_int64 nDatatoRead_local;
  void *pBuffer_local;
  void *pHandle_local;
  
  if (pHandle == (void *)0x0) {
    pHandle_local = (void *)0xffffffffffffffff;
  }
  else if (*(int *)((long)pHandle + 8) == 1) {
    pHandle_local = (void *)read((int)*(undefined8 *)((long)pHandle + 0x10),pBuffer,nDatatoRead);
    if ((long)pHandle_local < 1) {
      pHandle_local = (void *)0xffffffffffffffff;
    }
  }
  else {
    pHandle_local = (void *)0xffffffffffffffff;
  }
  return (jx9_int64)pHandle_local;
}

Assistant:

static jx9_int64 JX9StreamData_Read(void *pHandle, void *pBuffer, jx9_int64 nDatatoRead)
{
	jx9_stream_data *pData = (jx9_stream_data *)pHandle;
	if( pData == 0 ){
		return -1;
	}
	if( pData->iType != JX9_IO_STREAM_STDIN ){
		/* Forbidden */
		return -1;
	}
#ifdef __WINNT__
	{
		DWORD nRd;
		BOOL rc;
		rc = ReadFile(pData->x.pHandle, pBuffer, (DWORD)nDatatoRead, &nRd, 0);
		if( !rc ){
			/* IO error */
			return -1;
		}
		return (jx9_int64)nRd;
	}
#elif defined(__UNIXES__)
	{
		ssize_t nRd;
		int fd;
		fd = SX_PTR_TO_INT(pData->x.pHandle);
		nRd = read(fd, pBuffer, (size_t)nDatatoRead);
		if( nRd < 1 ){
			return -1;
		}
		return (jx9_int64)nRd;
	}
#else
	return -1;
#endif
}